

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int adiak_executable(void)

{
  int iVar1;
  char *pcVar2;
  char **ppcStack_1020;
  int result;
  char *filepart;
  char path [4097];
  int local_c;
  
  iVar1 = adksys_get_executable((char *)&filepart,0x1001);
  if (iVar1 == -1) {
    local_c = -1;
  }
  else {
    pcVar2 = strrchr((char *)&filepart,0x2f);
    if (pcVar2 == (char *)0x0) {
      ppcStack_1020 = &filepart;
    }
    else {
      ppcStack_1020 = (char **)(pcVar2 + 1);
    }
    adiak_namevalue("executable",2,"binary","%s",ppcStack_1020);
    local_c = 0;
  }
  return local_c;
}

Assistant:

int adiak_executable()
{
   char path[MAX_PATH_LEN+1];
   char *filepart;
   int result;

   result = adksys_get_executable(path, sizeof(path));
   if (result == -1)
      return -1;

   filepart = strrchr(path, '/');
   if (!filepart)
      filepart = path;
   else
      filepart++;

   adiak_namevalue("executable", adiak_general, "binary", "%s", filepart);
   return 0;
}